

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,REF_INT node)

{
  int geom;
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_ADJ pRVar3;
  uint uVar4;
  REF_INT RVar5;
  long in_RAX;
  REF_ADJ_ITEM pRVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined8 uStack_38;
  
  ref_geom = ref_grid->geom;
  pRVar2 = ref_geom->ref_adj;
  RVar5 = -1;
  uStack_38 = in_RAX;
  if ((-1 < node) && (node < pRVar2->nnode)) {
    RVar5 = pRVar2->first[(uint)node];
  }
joined_r0x00128b59:
  if (RVar5 == -1) {
    uStack_38._4_4_ = 0;
  }
  else {
    pRVar6 = pRVar2->item + RVar5;
    geom = pRVar6->ref;
    iVar1 = ref_geom->descr[(long)geom * 6];
    if (iVar1 == 0) goto LAB_00128c8b;
    if (iVar1 == 1) {
      lVar7 = 0;
      bVar9 = false;
      do {
        if ((-1 < node) && (!bVar9)) {
          pRVar3 = ref_grid->cell[lVar7]->ref_adj;
          if (node < pRVar3->nnode) {
            bVar9 = pRVar3->first[(uint)node] != -1;
          }
          else {
            bVar9 = false;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if (bVar9) goto LAB_00128c8b;
      uVar4 = ref_geom_remove(ref_geom,geom);
      if (uVar4 != 0) {
        uVar8 = 0x268;
LAB_00128c4d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar8,"ref_geom_remove_without_cell",(ulong)uVar4,"remove");
        uStack_38 = (ulong)uVar4 << 0x20;
      }
LAB_00128c6a:
      if (uVar4 == 0) goto code_r0x00128c6f;
    }
    else {
      if (iVar1 == 2) {
        lVar7 = 0;
        bVar9 = false;
        do {
          if ((-1 < node) && (!bVar9)) {
            pRVar3 = ref_grid->cell[lVar7 + 3]->ref_adj;
            if (node < pRVar3->nnode) {
              bVar9 = pRVar3->first[(uint)node] != -1;
            }
            else {
              bVar9 = false;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (!bVar9) {
          uVar4 = ref_geom_remove(ref_geom,geom);
          if (uVar4 != 0) {
            uVar8 = 0x275;
            goto LAB_00128c4d;
          }
          goto LAB_00128c6a;
        }
        goto LAB_00128c8b;
      }
      uStack_38._4_4_ = 6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x27a,
             "ref_geom_remove_without_cell",6,"can\'t to geom type yet");
    }
  }
  return uStack_38._4_4_;
code_r0x00128c6f:
  RVar5 = -1;
  if ((-1 < node) && (node < pRVar2->nnode)) {
    pRVar6 = (REF_ADJ_ITEM)(pRVar2->first + (uint)node);
LAB_00128c8b:
    RVar5 = pRVar6->next;
  }
  goto joined_r0x00128b59;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,
                                                REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_CELL ref_cell;
  REF_INT type, item, geom, group;
  REF_BOOL supported_by_cell;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);
    type = ref_geom_type(ref_geom, geom);
    switch (type) {
      case REF_GEOM_NODE:
        item = ref_adj_item_next(ref_adj, item);
        break;
      case REF_GEOM_EDGE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_edge_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      case REF_GEOM_FACE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_face_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "can't to geom type yet");
    }
  }

  return REF_SUCCESS;
}